

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *this_00;
  uint64 uVar2;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  EpsCopyInputStream *in_stack_ffffffffffffffa8;
  ParseContext *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits in_stack_ffffffffffffffd4;
  EpsCopyInputStream *pEVar3;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  this_00 = GetArenaNoVirtual((MethodDescriptorProto *)in_stack_ffffffffffffffb0);
  local_20 = in_RSI;
  do {
    bVar1 = internal::ParseContext::Done
                      (in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->limit_end_);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00515458;
    local_20 = internal::ReadTag((char *)in_RDX,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                          in_stack_ffffffffffffffd0),
                                 (uint32)((ulong)this_00 >> 0x20));
    if (local_20 == (char *)0x0) break;
    in_stack_ffffffffffffffb0 = (ParseContext *)(ulong)((in_stack_ffffffffffffffc4 >> 3) - 1);
    switch(in_stack_ffffffffffffffb0) {
    case (ParseContext *)0x0:
      if ((in_stack_ffffffffffffffc4 & 0xff) != 10) break;
      _internal_mutable_name_abi_cxx11_
                ((MethodDescriptorProto *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)
                            CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                     in_stack_ffffffffffffffd0),(char *)this_00,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_RDI);
      goto joined_r0x00515262;
    case (ParseContext *)0x1:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x12) {
        _internal_mutable_input_type_abi_cxx11_
                  ((MethodDescriptorProto *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)
                              CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                       in_stack_ffffffffffffffd0),(char *)this_00,
                              (ParseContext *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_RDI);
        goto joined_r0x00515262;
      }
      break;
    case (ParseContext *)0x2:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x1a) {
        _internal_mutable_output_type_abi_cxx11_
                  ((MethodDescriptorProto *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)
                              CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                       in_stack_ffffffffffffffd0),(char *)this_00,
                              (ParseContext *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_RDI);
        goto joined_r0x00515262;
      }
      break;
    case (ParseContext *)0x3:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x22) {
        pEVar3 = in_RDX;
        _internal_mutable_options((MethodDescriptorProto *)in_stack_ffffffffffffffb0);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                             ((ParseContext *)this_00,
                              (MethodOptions *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_RDI);
        in_stack_ffffffffffffffa8 = in_RDX;
        in_RDX = pEVar3;
        goto joined_r0x00515262;
      }
      break;
    case (ParseContext *)0x4:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x28) {
        _Internal::set_has_client_streaming((HasBits *)&stack0xffffffffffffffd4);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        (in_RDI->super_EpsCopyInputStream).buffer_[0x10] = uVar2 != 0;
        goto joined_r0x00515262;
      }
      break;
    case (ParseContext *)0x5:
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x30) {
        _Internal::set_has_server_streaming((HasBits *)&stack0xffffffffffffffd4);
        uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffffb0);
        (in_RDI->super_EpsCopyInputStream).buffer_[0x11] = uVar2 != 0;
        goto joined_r0x00515262;
      }
    }
    if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
      internal::EpsCopyInputStream::SetLastTag(in_RDX,in_stack_ffffffffffffffc4);
      goto LAB_00515458;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                          (InternalMetadataWithArena *)this_00,
                          (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_RDI);
joined_r0x00515262:
  } while (local_20 != (char *)0x0);
  local_20 = (char *)0x0;
LAB_00515458:
  internal::HasBits<1UL>::Or
            ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
             (HasBits<1UL> *)&stack0xffffffffffffffd4);
  return local_20;
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.MethodDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_input_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.input_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_output_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.output_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}